

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

EffectiveSign __thiscall
slang::ast::UnaryExpression::getEffectiveSignImpl(UnaryExpression *this,bool isForConversion)

{
  UnaryOperator UVar1;
  bool bVar2;
  EffectiveSign EVar3;
  UnaryExpression *in_RDI;
  undefined1 in_stack_ffffffffffffffdf;
  
  UVar1 = in_RDI->op;
  if (UVar1 != Plus) {
    if (UVar1 == Minus) {
      return Signed;
    }
    if (UVar1 != BitwiseNot) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa1af48)
      ;
      bVar2 = Type::isSigned((Type *)in_RDI);
      return (uint)bVar2;
    }
  }
  operand(in_RDI);
  EVar3 = Expression::getEffectiveSign(&in_RDI->super_Expression,(bool)in_stack_ffffffffffffffdf);
  return EVar3;
}

Assistant:

Expression::EffectiveSign UnaryExpression::getEffectiveSignImpl(bool isForConversion) const {
    switch (op) {
        case UnaryOperator::Plus:
        case UnaryOperator::BitwiseNot:
            return operand().getEffectiveSign(isForConversion);
        case UnaryOperator::Minus:
            // If we're negating a number it should be signed.
            return EffectiveSign::Signed;
        default:
            return type->isSigned() ? EffectiveSign::Signed : EffectiveSign::Unsigned;
    }
}